

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)

{
  sxi32 *psVar1;
  unqlite_kv_engine *puVar2;
  Page *pPVar3;
  unqlite_kv_io *puVar4;
  unqlite *pDb;
  unqlite_file *puVar5;
  SyMemBackend *pBackend;
  Page *pPage;
  int iVar6;
  Page **ppPVar7;
  unqlite_kv_engine *puVar8;
  uint uVar9;
  Page **ppPVar10;
  unqlite_kv_engine *puVar11;
  unqlite_kv_engine *puVar12;
  unqlite_kv_methods *puVar13;
  
  if (pPager->iState < 2) {
    return 0;
  }
  if (pPager->is_mem != 0) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-Only database");
    return -0x4b;
  }
  if (pPager->iState == 2) {
    if (pPager->iLock != 0) {
      (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
      pPager->iLock = 1;
    }
    pPager->iState = 1;
    return 0;
  }
  if (pPager->no_jrnl == 0) {
    puVar5 = pPager->pjfd;
    if (puVar5 != (unqlite_file *)0x0) {
      (*puVar5->pMethods->xSync)(puVar5,2);
      puVar5 = pPager->pjfd;
      if (puVar5 != (unqlite_file *)0x0) {
        pBackend = pPager->pAllocator;
        (*puVar5->pMethods->xClose)(puVar5);
        SyMemBackendFree(pBackend,puVar5);
      }
    }
    pPager->pjfd = (unqlite_file *)0x0;
    if (((pPager->iFlags & 3) != 0) && (iVar6 = pager_journal_rollback(pPager,0), iVar6 != 0)) {
      psVar1 = &pPager->pDb->iFlags;
      *psVar1 = *psVar1 | 1;
      return iVar6;
    }
  }
  (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
  puVar2 = pPager->pEngine;
  *(byte *)&pPager->iFlags = (byte)pPager->iFlags & 0xfc;
  pPager->iJournalOfft = 0;
  pPager->nRec = 0;
  pPager->dbSize = pPager->dbOrigSize;
  pPage = pPager->pAll;
  while (pPage != (Page *)0x0) {
    pPVar3 = pPage->pNext;
    *(byte *)&pPage->flags = (byte)pPage->flags & 0x91;
    pager_release_page(pPager,pPage);
    pPage = pPVar3;
  }
  pPager->nPage = 0;
  pPager->pFirstDirty = (Page *)0x0;
  pPager->pDirty = (Page *)0x0;
  pPager->pAll = (Page *)0x0;
  pPager->pHotDirty = (Page *)0x0;
  *(undefined8 *)((long)&pPager->pHotDirty + 4) = 0;
  *(undefined8 *)((long)&pPager->pFirstHot + 4) = 0;
  ppPVar7 = pPager->apHash;
  if ((ppPVar7 != (Page **)0x0) && (uVar9 = pPager->nSize << 3, uVar9 != 0)) {
    ppPVar10 = (Page **)((ulong)uVar9 + (long)ppPVar7);
    do {
      *(undefined1 *)ppPVar7 = 0;
      if (ppPVar10 <= (Page **)((long)ppPVar7 + 1)) break;
      *(undefined1 *)((long)ppPVar7 + 1) = 0;
      if (ppPVar10 <= (Page **)((long)ppPVar7 + 2)) break;
      *(undefined1 *)((long)ppPVar7 + 2) = 0;
      if (ppPVar10 <= (Page **)((long)ppPVar7 + 3)) break;
      *(undefined1 *)((long)ppPVar7 + 3) = 0;
      ppPVar7 = (Page **)((long)ppPVar7 + 4);
    } while (ppPVar7 < ppPVar10);
  }
  if (pPager->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPager->pVec);
    pPager->pVec = (Bitvec *)0x0;
  }
  if (pPager->iLock != 0) {
    (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    pPager->iLock = 1;
  }
  pPager->iState = 1;
  if (bResetKvEngine == 0) {
    return 0;
  }
  puVar4 = puVar2->pIo;
  puVar13 = puVar4->pMethods;
  if (puVar13->xRelease != (_func_void_unqlite_kv_engine_ptr *)0x0) {
    (*puVar13->xRelease)(puVar2);
    puVar13 = puVar4->pMethods;
  }
  if ((ulong)(uint)puVar13->szKv != 0) {
    puVar8 = (unqlite_kv_engine *)((long)&puVar2->pIo + (ulong)(uint)puVar13->szKv);
    puVar11 = puVar2;
    do {
      *(undefined1 *)&puVar11->pIo = 0;
      puVar12 = (unqlite_kv_engine *)((long)&puVar11->pIo + 1);
      if (puVar8 <= puVar12) break;
      *(undefined1 *)&puVar12->pIo = 0;
      puVar12 = (unqlite_kv_engine *)((long)&puVar11->pIo + 2);
      if (puVar8 <= puVar12) break;
      *(undefined1 *)&puVar12->pIo = 0;
      puVar12 = (unqlite_kv_engine *)((long)&puVar11->pIo + 3);
      if (puVar8 <= puVar12) break;
      *(undefined1 *)&puVar12->pIo = 0;
      puVar11 = (unqlite_kv_engine *)((long)&puVar11->pIo + 4);
    } while (puVar11 < puVar8);
    puVar13 = puVar4->pMethods;
  }
  puVar2->pIo = puVar4;
  if (puVar13->xInit != (_func_int_unqlite_kv_engine_ptr_int *)0x0) {
    iVar6 = (*puVar13->xInit)(puVar2,pPager->iPageSize);
    if (iVar6 != 0) goto LAB_0010ec4e;
    puVar13 = puVar4->pMethods;
  }
  if (puVar13->xOpen == (_func_int_unqlite_kv_engine_ptr_pgno *)0x0) {
    return 0;
  }
  iVar6 = (*puVar13->xOpen)(puVar2,pPager->dbSize);
  if (iVar6 == 0) {
    return 0;
  }
LAB_0010ec4e:
  pDb = pPager->pDb;
  psVar1 = &pDb->iFlags;
  *psVar1 = *psVar1 | 1;
  unqliteGenError(pDb,"Error while reseting pager to its initial state");
  return iVar6;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)
{
	int rc = UNQLITE_OK;
	if( pPager->iState < PAGER_WRITER_LOCKED ){
		/* A write transaction must be opened */
		return UNQLITE_OK;
	}
	if( pPager->is_mem ){
		/* As of this release 1.1.6: Transactions are not supported for in-memory databases */
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		/* Read-Only DB */
		unqliteGenError(pPager->pDb,"Read-Only database");
		return UNQLITE_READ_ONLY;
	}
	if( pPager->iState >= PAGER_WRITER_CACHEMOD ){
		if( !pPager->no_jrnl ){
			/* Close any outstanding joural file */
			if( pPager->pjfd ){
				/* Sync the journal file */
				unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
			}
			unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
			pPager->pjfd = 0;
			if( pPager->iFlags & (PAGER_CTRL_COMMIT_ERR|PAGER_CTRL_DIRTY_COMMIT) ){
				/* Perform the rollback */
				rc = pager_journal_rollback(pPager,0);
				if( rc != UNQLITE_OK ){
					/* Set the auto-commit flag */
					pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
					return rc;
				}
			}
		}
		/* Unlink the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
		/* Reset the pager state */
		rc = pager_reset_state(pPager,bResetKvEngine);
		if( rc != UNQLITE_OK ){
			/* Mostly an unlikely scenario */
			pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT; /* Set the auto-commit flag */
			unqliteGenError(pPager->pDb,"Error while reseting pager to its initial state");
			return rc;
		}
	}else{
		/* Downgrade to shared lock */
		pager_unlock_db(pPager,SHARED_LOCK);
		pPager->iState = PAGER_READER;
	}
	return UNQLITE_OK;
}